

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteFuncDeclarations(CWriter *this)

{
  bool bVar1;
  size_type sVar2;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *this_00;
  reference ppFVar3;
  FuncDeclaration *decl;
  string_view name;
  Newline local_81;
  string_view local_80;
  string local_70;
  string_view local_50;
  undefined1 local_39;
  Func *pFStack_38;
  bool is_import;
  Func *func;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *__range2;
  Index func_index;
  CWriter *this_local;
  
  sVar2 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&this->module_->funcs);
  if (sVar2 != this->module_->num_func_imports) {
    Write(this);
    __range2._0_4_ = 0;
    this_00 = &this->module_->funcs;
    __end2 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::begin(this_00);
    func = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
                                  *)&func);
      if (!bVar1) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
                ::operator*(&__end2);
      pFStack_38 = *ppFVar3;
      local_39 = (uint)__range2 < this->module_->num_func_imports;
      if (!(bool)local_39) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_50,"static ");
        Write(this,local_50);
        decl = &pFStack_38->decl;
        name = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pFStack_38);
        local_80 = name;
        (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                  (&local_70,(CWriter *)this,Func,name);
        WriteFuncDeclaration(this,decl,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])0x21ded1,&local_81);
      }
      __range2._0_4_ = (uint)__range2 + 1;
      __gnu_cxx::
      __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void CWriter::WriteFuncDeclarations() {
  if (module_->funcs.size() == module_->num_func_imports)
    return;

  Write(Newline());

  Index func_index = 0;
  for (const Func* func : module_->funcs) {
    bool is_import = func_index < module_->num_func_imports;
    if (!is_import) {
      Write("static ");
      WriteFuncDeclaration(
          func->decl, DefineGlobalScopeName(ModuleFieldType::Func, func->name));
      Write(";", Newline());
    }
    ++func_index;
  }
}